

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

MutableStringView __thiscall Corrade::Containers::String::find(String *this,StringView substring)

{
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> BStack_28;
  
  BasicStringView<char>::BasicStringView(&BStack_28,this);
  BVar1 = BasicStringView<char>::findOr(&BStack_28,substring,(char *)0x0);
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::find(const StringView substring) {
    /* Calling straight into the concrete implementation to reduce call stack
       depth */
    return MutableStringView{*this}.findOr(substring, nullptr);
}